

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O3

void cf_gf128_double_le(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  uint uVar6;
  byte bVar7;
  byte local_2 [2];
  
  local_2[1] = 0;
  local_2[0] = 0xe1;
  uVar6 = *in;
  uVar3 = uVar6 >> 1;
  *out = uVar3;
  uVar1 = in[1];
  out[1] = uVar6 << 0x1f | uVar1 >> 1;
  uVar6 = in[2];
  out[2] = uVar1 << 0x1f | uVar6 >> 1;
  uVar1 = in[3];
  out[3] = uVar6 << 0x1f | uVar1 >> 1;
  bVar7 = 0;
  uVar6 = 0;
  pbVar4 = local_2 + 1;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    if (bVar7 == ((byte)uVar1 & 1)) {
      uVar6 = (uint)*pbVar4;
    }
    bVar7 = 1;
    pbVar4 = local_2;
    bVar2 = false;
  } while (bVar5);
  *out = uVar6 << 0x18 ^ uVar3;
  return;
}

Assistant:

void cf_gf128_double_le(const cf_gf128 in, cf_gf128 out)
{
  uint8_t table[2] = { 0x00, 0xe1 };
  uint32_t borrow = 0;
  uint32_t inword;

  inword = in[0];   out[0] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;
  inword = in[1];   out[1] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;
  inword = in[2];   out[2] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;
  inword = in[3];   out[3] = (inword >> 1) | (borrow << 31);  borrow = inword & 1;

#if CF_CACHE_SIDE_CHANNEL_PROTECTION
  out[0] ^= (uint32_t)select_u8(borrow, table, 2) << 24;
#else
  out[0] ^= (uint32_t)table[borrow] << 24;
#endif
}